

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O1

int sat_solver3_minimize_assumptions(sat_solver3 *s,int *pLits,int nLits,int nConfLimit)

{
  bool bVar1;
  ABC_INT64_T AVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  
LAB_008f7189:
  while( true ) {
    if (nLits == 1) {
      AVar2 = s->nConfLimit;
      s->nConfLimit = (long)nConfLimit;
      iVar8 = sat_solver3_solve_internal(s);
      s->nConfLimit = (long)(int)AVar2;
      return (uint)(iVar8 != -1);
    }
    if (nLits < 2) {
      __assert_fail("nLits >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                    ,0x865,"int sat_solver3_minimize_assumptions(sat_solver3 *, int *, int, int)");
    }
    uVar3 = (uint)nLits >> 1;
    uVar7 = (ulong)uVar3;
    iVar8 = 1;
    uVar11 = 0;
    do {
      iVar4 = sat_solver3_push(s,pLits[uVar11]);
      if (iVar4 == 0) goto LAB_008f736f;
      uVar11 = uVar11 + 1;
      iVar8 = iVar8 + 1;
    } while (uVar7 != uVar11);
    uVar5 = sat_solver3_minimize_assumptions(s,pLits + uVar7,nLits - uVar3,nConfLimit);
    uVar11 = 1;
    if (1 < uVar3) {
      uVar11 = uVar7;
    }
    do {
      sat_solver3_pop(s);
      uVar9 = (int)uVar11 - 1;
      uVar11 = (ulong)uVar9;
    } while (uVar9 != 0);
    if ((s->temp_clause).size < 0) {
      __assert_fail("k <= v->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satVec.h"
                    ,0x30,"void veci_resize(veci *, int)");
    }
    (s->temp_clause).size = 0;
    uVar11 = 1;
    if (1 < uVar3) {
      uVar11 = uVar7;
    }
    uVar10 = 0;
    do {
      iVar8 = pLits[uVar10];
      uVar9 = (s->temp_clause).cap;
      if ((s->temp_clause).size == uVar9) {
        iVar4 = (uVar9 >> 1) * 3;
        if ((int)uVar9 < 4) {
          iVar4 = uVar9 * 2;
        }
        piVar6 = (s->temp_clause).ptr;
        if (piVar6 == (int *)0x0) {
          piVar6 = (int *)malloc((long)iVar4 << 2);
        }
        else {
          piVar6 = (int *)realloc(piVar6,(long)iVar4 << 2);
        }
        (s->temp_clause).ptr = piVar6;
        if (piVar6 == (int *)0x0) {
          printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                 (double)(s->temp_clause).cap * 9.5367431640625e-07,
                 (double)iVar4 * 9.5367431640625e-07);
          fflush(_stdout);
        }
        (s->temp_clause).cap = iVar4;
      }
      iVar4 = (s->temp_clause).size;
      (s->temp_clause).size = iVar4 + 1;
      (s->temp_clause).ptr[iVar4] = iVar8;
      uVar10 = uVar10 + 1;
    } while (uVar11 != uVar10);
    if (0 < (int)uVar5) {
      uVar11 = 0;
      do {
        pLits[uVar11] = (pLits + uVar7)[uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar5 != uVar11);
    }
    piVar6 = (s->temp_clause).ptr;
    uVar11 = 1;
    if (1 < uVar3) {
      uVar11 = uVar7;
    }
    uVar7 = 0;
    do {
      (pLits + (int)uVar5)[uVar7] = piVar6[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar11 != uVar7);
    if ((int)uVar5 < 1) break;
    iVar8 = 1;
    uVar7 = 0;
    while (iVar4 = sat_solver3_push(s,pLits[uVar7]), iVar4 != 0) {
      uVar7 = uVar7 + 1;
      iVar8 = iVar8 + 1;
      if (uVar5 == uVar7) goto LAB_008f73a0;
    }
    do {
      sat_solver3_pop(s);
      iVar4 = iVar8 + -1;
      bVar1 = 0 < iVar8;
      iVar8 = iVar4;
    } while (iVar4 != 0 && bVar1);
    nLits = (int)uVar7 + 1;
  }
LAB_008f73a0:
  iVar8 = sat_solver3_minimize_assumptions(s,pLits + (int)uVar5,uVar3,nConfLimit);
  uVar3 = uVar5;
  if (0 < (int)uVar5) {
    do {
      sat_solver3_pop(s);
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return iVar8 + uVar5;
LAB_008f736f:
  do {
    sat_solver3_pop(s);
    iVar4 = iVar8 + -1;
    bVar1 = 0 < iVar8;
    iVar8 = iVar4;
  } while (iVar4 != 0 && bVar1);
  nLits = (int)uVar11 + 1;
  goto LAB_008f7189;
}

Assistant:

int sat_solver3_minimize_assumptions( sat_solver3* s, int * pLits, int nLits, int nConfLimit )
{
    int i, k, nLitsL, nLitsR, nResL, nResR;
    if ( nLits == 1 )
    {
        // since the problem is UNSAT, we will try to solve it without assuming the last literal
        // if the result is UNSAT, the last literal can be dropped; otherwise, it is needed
        int status = l_False;
        int Temp = s->nConfLimit; 
        s->nConfLimit = nConfLimit;
        status = sat_solver3_solve_internal( s );
        s->nConfLimit = Temp;
        return (int)(status != l_False); // return 1 if the problem is not UNSAT
    }
    assert( nLits >= 2 );
    nLitsL = nLits / 2;
    nLitsR = nLits - nLitsL;
    // assume the left lits
    for ( i = 0; i < nLitsL; i++ )
        if ( !sat_solver3_push(s, pLits[i]) )
        {
            for ( k = i; k >= 0; k-- )
                sat_solver3_pop(s);
            return sat_solver3_minimize_assumptions( s, pLits, i+1, nConfLimit );
        }
    // solve for the right lits
    nResL = sat_solver3_minimize_assumptions( s, pLits + nLitsL, nLitsR, nConfLimit );
    for ( i = 0; i < nLitsL; i++ )
        sat_solver3_pop(s);
    // swap literals
//    assert( nResL <= nLitsL );
//    for ( i = 0; i < nResL; i++ )
//        ABC_SWAP( int, pLits[i], pLits[nLitsL+i] );
    veci_resize( &s->temp_clause, 0 );
    for ( i = 0; i < nLitsL; i++ )
        veci_push( &s->temp_clause, pLits[i] );
    for ( i = 0; i < nResL; i++ )
        pLits[i] = pLits[nLitsL+i];
    for ( i = 0; i < nLitsL; i++ )
        pLits[nResL+i] = veci_begin(&s->temp_clause)[i];
    // assume the right lits
    for ( i = 0; i < nResL; i++ )
        if ( !sat_solver3_push(s, pLits[i]) )
        {
            for ( k = i; k >= 0; k-- )
                sat_solver3_pop(s);
            return sat_solver3_minimize_assumptions( s, pLits, i+1, nConfLimit );
        }
    // solve for the left lits
    nResR = sat_solver3_minimize_assumptions( s, pLits + nResL, nLitsL, nConfLimit );
    for ( i = 0; i < nResL; i++ )
        sat_solver3_pop(s);
    return nResL + nResR;
}